

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  istream *this;
  ostream *this_00;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_68;
  pair<int,_int> local_4c [3];
  int local_34;
  int local_30;
  int b;
  int a;
  int n;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> v;
  
  v.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&a);
  std::istream::operator>>((istream *)&std::cin,&b);
  while (b != 0) {
    b = b + -1;
    this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_30);
    std::istream::operator>>(this,&local_34);
    local_4c[0] = std::make_pair<int&,int&>(&local_30,&local_34);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&a,local_4c);
  }
  b = b + -1;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_68,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&a);
  iVar1 = eval_postfix(&local_68);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector(&local_68);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&a);
  return v.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
    vector<pair<int, int>> v;
    int n, a, b;
    cin >> n;
    while (n--) {
        cin >> a >> b;
        v.push_back(make_pair(a, b));
    }
    cout << eval_postfix(v) << endl;
}